

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumeralMultiplicationGeneralizationImpl.hpp
# Opt level: O3

Result Inferences::NumeralMultiplicationGeneralizationImpl::applyRule
                 (Clause *cl,bool doOrderingCheck)

{
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
  *this;
  uint uVar1;
  mp_limb_t *pmVar2;
  undefined8 uVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  byte *pbVar8;
  undefined4 uVar9;
  Clause *cl_00;
  long lVar10;
  Entry *pEVar11;
  Entry *pEVar12;
  undefined7 in_register_00000031;
  char *pcVar13;
  uint code;
  uint uVar14;
  IntegerConstantType *pIVar15;
  RealConstantType *pRVar16;
  Entry *pEVar17;
  uint code_1;
  long lVar18;
  Result RVar19;
  Option<Kernel::Variable> var;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> factor_1;
  NumeralMap numerals;
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> factor;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> monom_1;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  numeral_1;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> monom;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  numeral;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  num;
  char local_2f0;
  MaybeUninit<Kernel::Variable> local_2ec;
  PolyNf local_2e8;
  int local_2d0;
  Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
  local_2c8;
  long local_2a0;
  RationalConstantType local_298;
  undefined1 local_270 [16];
  __mpz_struct _Stack_260;
  int local_250;
  mp_limb_t *local_248;
  long local_240;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  local_238;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  local_208;
  undefined1 local_1e0 [40];
  Clause *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [36];
  undefined4 local_184;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  local_180;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  local_158;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  local_130;
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
  *local_108;
  Option<Kernel::AnyPoly> local_100;
  undefined1 local_e8 [2];
  undefined1 auStack_e6 [16];
  IntegerConstantType local_d6;
  undefined1 local_c0;
  OptionBase<Kernel::PolyNf::SubtermIter> local_a0;
  MaybeUninit<Kernel::Variable> local_5c;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
  local_58;
  undefined1 local_34;
  
  local_184 = (undefined4)CONCAT71(in_register_00000031,doOrderingCheck);
  local_2c8._capacity = 0;
  local_2c8._noOfEntries = 0;
  local_2c8._entries = (Entry *)0x0;
  Lib::
  Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
  ::expand(&local_2c8);
  local_1b8 = cl;
  Inferences::anon_class_1_0_00000001::operator()
            ((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
              *)local_e8,(anon_class_1_0_00000001 *)cl,cl_00);
  local_108 = (IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
               *)local_e8;
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
  ::tryNext(&local_100,
            (IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
             *)local_e8);
  if (local_100.super_OptionBase<Kernel::AnyPoly>._isSome == true) {
    do {
      local_1b0 = CONCAT53(local_100.super_OptionBase<Kernel::AnyPoly>._elem._elem._12_5_,
                           local_100.super_OptionBase<Kernel::AnyPoly>._elem._elem._9_3_);
      if ((local_100.super_OptionBase<Kernel::AnyPoly>._elem._elem._0_1_ & 3) == 0) {
        pIVar15 = *(IntegerConstantType **)(local_1b0 + 8);
        lVar10 = *(long *)(local_1b0 + 0x10) - (long)pIVar15;
        if (pIVar15 != (IntegerConstantType *)0x0 && lVar10 != 0) {
          lVar10 = lVar10 >> 5;
          local_240 = lVar10 + (ulong)(lVar10 == 0);
          lVar10 = 1;
          do {
            local_2a0 = lVar10;
            Kernel::IntegerConstantType::IntegerConstantType
                      ((IntegerConstantType *)local_1a8,pIVar15);
            local_1a8._16_4_ = pIVar15[1]._val[0]._mp_alloc;
            pmVar2 = pIVar15[1]._val[0]._mp_d;
            pbVar8 = (byte *)pmVar2[1];
            local_1a8._24_8_ = pmVar2;
            if (pbVar8 != (byte *)0x0 && pmVar2[2] - (long)pbVar8 != 0) {
              lVar18 = ((long)(pmVar2[2] - (long)pbVar8) >> 2) * 0x6db6db6db6db6db7;
              lVar10 = 1;
              do {
                local_298._num._val[0]._mp_size._1_1_ = 0;
                local_298._num._val[0]._mp_d._1_1_ = 0;
                local_298._num._val[0]._mp_d._2_6_ = 0;
                local_298._den._val[0]._mp_alloc._0_1_ = 0;
                local_298._den._val[0]._1_4_ = 0;
                local_298._den._val[0]._mp_size._1_3_ = 0;
                local_298._num._val[0]._mp_alloc._0_1_ = *pbVar8 & 3;
                if ((byte)local_298._num._val[0]._mp_alloc == 0) {
                  local_298._num._val[0]._1_4_ = *(undefined4 *)(pbVar8 + 1);
                  uVar3 = *(undefined8 *)(pbVar8 + 9);
                  local_298._num._val[0]._mp_d._1_1_ = (undefined1)uVar3;
                  local_298._num._val[0]._mp_d._2_6_ = (undefined6)((ulong)uVar3 >> 8);
                  local_298._den._val[0]._mp_alloc._0_1_ = (undefined1)((ulong)uVar3 >> 0x38);
                }
                else if ((byte)local_298._num._val[0]._mp_alloc == 1) {
                  local_298._num._val[0]._1_4_ = *(undefined4 *)(pbVar8 + 1);
                }
                else {
                  local_298._num._val[0]._mp_d._1_1_ = 0;
                  uVar3 = *(undefined8 *)(pbVar8 + 10);
                  local_298._num._val[0]._1_4_ = *(uint *)(pbVar8 + 1) & 0xffffff03;
                  local_298._num._val[0]._mp_size._1_1_ =
                       (undefined1)((uint)*(undefined4 *)(pbVar8 + 2) >> 0x18);
                  local_298._num._val[0]._mp_d._2_6_ = (undefined6)uVar3;
                  local_298._den._val[0]._mp_alloc._0_1_ = (undefined1)((ulong)uVar3 >> 0x30);
                  local_298._den._val[0]._mp_alloc._1_1_ = (byte)((ulong)uVar3 >> 0x38);
                  local_298._den._val[0]._2_3_ = 0;
                }
                local_298._num._val[0]._mp_d._0_1_ = 0;
                local_298._num._val[0]._mp_size._2_2_ = 0;
                local_298._den._val[0]._mp_d._0_4_ = *(int *)(pbVar8 + 0x18);
                Kernel::PolyNf::tryVar((PolyNf *)&local_298);
                if (local_2f0 == '\x01') {
                  AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>::AnyNumber
                            ((AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>
                              *)&local_238,(Numeral<IntTraits> *)local_1a8);
                  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                  ::FlatMeetLattice(&local_180,
                                    (AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>
                                     *)&local_238);
                  Lib::CoproductImpl::TrivialOperations::Destr::
                  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                  ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                  *)&local_238);
                  if ((int)local_298._den._val[0]._mp_d == 1) {
                    Kernel::IntegerConstantType::IntegerConstantType
                              ((IntegerConstantType *)&local_2e8,(Numeral<IntTraits> *)local_1a8);
                    bVar6 = canDivideBy((IntegerConstantType *)&local_2e8);
                    mpz_clear((__mpz_struct *)&local_2e8);
                    if (!bVar6) goto LAB_0048977a;
                    if (local_2c8._maxEntries <= local_2c8._noOfEntries) {
                      Lib::
                      Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
                      ::expand(&local_2c8);
                    }
                    uVar14 = (int)local_2ec +
                             (uint)(local_2ec == (MaybeUninit<Kernel::Variable>)0x0);
                    uVar4 = (ulong)uVar14 % (local_2c8._0_8_ & 0xffffffff);
                    pEVar12 = local_2c8._entries + uVar4;
                    uVar1 = local_2c8._entries[uVar4].code;
                    while (uVar1 != 0) {
                      if ((uVar1 == uVar14) && (pEVar12->_key == local_2ec)) {
                        Lib::CoproductImpl::TrivialOperations::MoveCons::
                        DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                        ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                       *)&local_130,
                                      (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                       *)&(pEVar12->_value).__align);
                        Lib::CoproductImpl::TrivialOperations::CopyCons::
                        DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                        ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                       *)local_270,
                                      (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                       *)&local_180);
                        FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                        ::meet((FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                                *)local_1e0,&local_130,
                               (FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                                *)local_270);
                        if ((local_270[0] & 1U) == 0) {
                          Lib::CoproductImpl::TrivialOperations::Destr::
                          DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                          ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                          *)(local_270 + 1));
                        }
                        Lib::CoproductImpl::TrivialOperations::MoveCons::
                        DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                        ::operator=((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                     *)&(pEVar12->_value).__align,
                                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                     *)local_1e0);
                        if ((local_1e0[0] & 1) == 0) {
                          Lib::CoproductImpl::TrivialOperations::Destr::
                          DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                          ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                          *)(local_1e0 + 1));
                        }
                        if ((local_130._inner._inner.
                             super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                             .
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                             .
                             super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                             ._0_1_ & 1) != 0) goto LAB_004897ce;
                        pcVar13 = (char *)((long)&local_130._inner._inner.
                                                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                                  .
                                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                                  .
                                                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                          + 1);
                        goto LAB_004897c9;
                      }
                      pEVar12 = pEVar12 + 1;
                      if (pEVar12 == local_2c8._afterLast) {
                        pEVar12 = local_2c8._entries;
                      }
                      uVar1 = pEVar12->code;
                    }
                    local_2c8._noOfEntries = local_2c8._noOfEntries + 1;
                    Lib::CoproductImpl::TrivialOperations::CopyCons::
                    DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                    ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                   *)&local_158,
                                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                   *)&local_180);
                    (pEVar12->_key).__align = (anon_struct_4_0_00000001_for___align)local_2ec;
                    Lib::CoproductImpl::TrivialOperations::MoveCons::
                    DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                   *)&(pEVar12->_value).__align,
                                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                   *)&local_158);
                    pEVar12->code = uVar14;
                    if ((local_158._inner._inner.
                         super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                         .
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                         .
                         super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                         ._0_1_ & 1) == 0) {
                      pcVar13 = (char *)((long)&local_158._inner._inner.
                                                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                                .
                                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                                .
                                                super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                        + 1);
                      goto LAB_004897c9;
                    }
                  }
                  else {
LAB_0048977a:
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[7] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[8] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[9] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[10] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0xb] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0xc] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0xd] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0xe] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0xf] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x10] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x11] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x12] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x13] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x14] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x15] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x16] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x17] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x18] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x19] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1a] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1b] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1c] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1d] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1e] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1f] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x20] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x21] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x22] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x23] = '\0';
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._37_3_ = 0;
                    local_208._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._0_8_ = 1;
                    Lib::
                    Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
                    ::replaceOrInsert(&local_2c8,(Variable)local_2ec.__align,&local_208);
                    if ((local_208._inner._inner.
                         super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                         .
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                         .
                         super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                         ._0_8_ & 1) == 0) {
                      pcVar13 = local_208._inner._inner.
                                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                .
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                .
                                super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                ._content;
LAB_004897c9:
                      Lib::CoproductImpl::TrivialOperations::Destr::
                      DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                      ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                      *)pcVar13);
                    }
                  }
LAB_004897ce:
                  if ((local_180._inner._inner.
                       super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                       .
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                       .
                       super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                       ._0_1_ & 1) == 0) {
                    Lib::CoproductImpl::TrivialOperations::Destr::
                    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                    ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                    *)((long)&local_180._inner._inner.
                                              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                              .
                                              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                              .
                                              super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                      + 1));
                  }
                }
                if (lVar10 == lVar18 + (ulong)(lVar18 == 0)) break;
                lVar5 = lVar10 * 0x1c;
                lVar10 = lVar10 + 1;
                pbVar8 = (byte *)(lVar5 + pmVar2[1]);
              } while (pmVar2[1] != 0);
            }
            mpz_clear((__mpz_struct *)local_1a8);
            if (local_2a0 == local_240) break;
            lVar10 = local_2a0 + 1;
            pIVar15 = (IntegerConstantType *)(local_2a0 * 0x20 + *(long *)(local_1b0 + 8));
          } while( true );
        }
      }
      else if ((local_100.super_OptionBase<Kernel::AnyPoly>._elem._elem._0_1_ & 3) == 1) {
        pIVar15 = *(IntegerConstantType **)(local_1b0 + 8);
        lVar10 = *(long *)(local_1b0 + 0x10) - (long)pIVar15;
        if (pIVar15 != (IntegerConstantType *)0x0 && lVar10 != 0) {
          local_240 = (lVar10 >> 4) * -0x5555555555555555;
          local_240 = local_240 + (ulong)(local_240 == 0);
          lVar10 = 1;
          do {
            Kernel::IntegerConstantType::IntegerConstantType
                      ((IntegerConstantType *)local_270,pIVar15);
            local_2a0 = lVar10;
            Kernel::IntegerConstantType::IntegerConstantType
                      ((IntegerConstantType *)&_Stack_260,pIVar15 + 1);
            local_250 = pIVar15[2]._val[0]._mp_alloc;
            pmVar2 = pIVar15[2]._val[0]._mp_d;
            pbVar8 = (byte *)pmVar2[1];
            local_248 = pmVar2;
            if (pbVar8 != (byte *)0x0 && pmVar2[2] - (long)pbVar8 != 0) {
              lVar10 = ((long)(pmVar2[2] - (long)pbVar8) >> 2) * 0x6db6db6db6db6db7;
              lVar18 = 1;
              do {
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[4] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[8] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[9] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[10] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0xb] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0xc] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0xd] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0xe] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0xf] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0x10] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0x11] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0x12] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0x13] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._21_3_ = 0;
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._0_1_ = *pbVar8 & 3;
                if (local_2e8.super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._0_1_ == 0) {
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content._0_4_ = *(undefined4 *)(pbVar8 + 1);
                  uVar3 = *(undefined8 *)(pbVar8 + 9);
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content[8] = (char)uVar3;
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content._9_6_ = SUB86((ulong)uVar3 >> 8,0);
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content[0xf] = (char)((ulong)uVar3 >> 0x38);
                }
                else if (local_2e8.super_PolyNfSuper._inner.
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                         .
                         super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                         ._0_1_ == 1) {
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content._0_4_ = *(undefined4 *)(pbVar8 + 1);
                }
                else {
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content[8] = '\0';
                  uVar3 = *(undefined8 *)(pbVar8 + 10);
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content._0_4_ = *(uint *)(pbVar8 + 1) & 0xffffff03;
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content[4] = (char)((uint)*(undefined4 *)(pbVar8 + 2) >> 0x18);
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content._9_6_ = SUB86(uVar3,0);
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content[0xf] = (char)((ulong)uVar3 >> 0x30);
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content[0x10] = (char)((ulong)uVar3 >> 0x38);
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content._17_3_ = 0;
                }
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[7] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[5] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[6] = '\0';
                local_2d0 = *(int *)(pbVar8 + 0x18);
                Kernel::PolyNf::tryVar(&local_2e8);
                if (local_2f0 == '\x01') {
                  AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>::AnyNumber
                            ((AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>
                              *)local_1a8,(Numeral<RatTraits> *)local_270);
                  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                  ::FlatMeetLattice(&local_208,
                                    (AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>
                                     *)local_1a8);
                  Lib::CoproductImpl::TrivialOperations::Destr::
                  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                  ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                  *)local_1a8);
                  if (local_2d0 == 1) {
                    Kernel::IntegerConstantType::IntegerConstantType
                              (&local_298._num,(IntegerConstantType *)local_270);
                    Kernel::IntegerConstantType::IntegerConstantType
                              (&local_298._den,(IntegerConstantType *)&_Stack_260);
                    bVar6 = canDivideBy(&local_298);
                    mpz_clear(local_298._den._val);
                    mpz_clear((__mpz_struct *)&local_298);
                    if (!bVar6) goto LAB_0048938e;
                    if (local_2c8._maxEntries <= local_2c8._noOfEntries) {
                      Lib::
                      Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
                      ::expand(&local_2c8);
                    }
                    uVar14 = (int)local_2ec +
                             (uint)(local_2ec == (MaybeUninit<Kernel::Variable>)0x0);
                    uVar4 = (ulong)uVar14 % (local_2c8._0_8_ & 0xffffffff);
                    pEVar12 = local_2c8._entries + uVar4;
                    uVar1 = local_2c8._entries[uVar4].code;
                    while (uVar1 != 0) {
                      if ((uVar1 == uVar14) && (pEVar12->_key == local_2ec)) {
                        Lib::CoproductImpl::TrivialOperations::MoveCons::
                        DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                        ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                       *)&local_158,
                                      (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                       *)&(pEVar12->_value).__align);
                        Lib::CoproductImpl::TrivialOperations::CopyCons::
                        DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                        ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                       *)local_1e0,
                                      (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                       *)&local_208);
                        FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                        ::meet(&local_130,&local_158,
                               (FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                                *)local_1e0);
                        if ((local_1e0[0] & 1) == 0) {
                          Lib::CoproductImpl::TrivialOperations::Destr::
                          DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                          ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                          *)(local_1e0 + 1));
                        }
                        Lib::CoproductImpl::TrivialOperations::MoveCons::
                        DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                        ::operator=((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                     *)&(pEVar12->_value).__align,
                                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                     *)&local_130);
                        if ((local_130._inner._inner.
                             super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                             .
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                             .
                             super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                             ._0_1_ & 1) == 0) {
                          Lib::CoproductImpl::TrivialOperations::Destr::
                          DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                          ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                          *)((long)&local_130._inner._inner.
                                                                                                        
                                                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                                  .
                                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                                  .
                                                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                            + 1));
                        }
                        if ((local_158._inner._inner.
                             super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                             .
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                             .
                             super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                             ._0_1_ & 1) != 0) goto LAB_004893dd;
                        pcVar13 = (char *)((long)&local_158._inner._inner.
                                                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                                  .
                                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                                  .
                                                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                          + 1);
                        goto LAB_004893d8;
                      }
                      pEVar12 = pEVar12 + 1;
                      if (pEVar12 == local_2c8._afterLast) {
                        pEVar12 = local_2c8._entries;
                      }
                      uVar1 = pEVar12->code;
                    }
                    local_2c8._noOfEntries = local_2c8._noOfEntries + 1;
                    Lib::CoproductImpl::TrivialOperations::CopyCons::
                    DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                    ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                   *)&local_180,
                                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                   *)&local_208);
                    (pEVar12->_key).__align = (anon_struct_4_0_00000001_for___align)local_2ec;
                    Lib::CoproductImpl::TrivialOperations::MoveCons::
                    DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                   *)&(pEVar12->_value).__align,
                                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                   *)&local_180);
                    pEVar12->code = uVar14;
                    if ((local_180._inner._inner.
                         super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                         .
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                         .
                         super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                         ._0_1_ & 1) == 0) {
                      pcVar13 = (char *)((long)&local_180._inner._inner.
                                                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                                .
                                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                                .
                                                super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                        + 1);
                      goto LAB_004893d8;
                    }
                  }
                  else {
LAB_0048938e:
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[7] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[8] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[9] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[10] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0xb] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0xc] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0xd] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0xe] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0xf] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x10] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x11] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x12] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x13] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x14] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x15] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x16] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x17] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x18] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x19] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1a] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1b] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1c] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1d] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1e] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1f] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x20] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x21] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x22] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x23] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._37_3_ = 0;
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._0_8_ = 1;
                    Lib::
                    Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
                    ::replaceOrInsert(&local_2c8,(Variable)local_2ec.__align,&local_238);
                    if ((local_238._inner._inner.
                         super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                         .
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                         .
                         super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                         ._0_8_ & 1) == 0) {
                      pcVar13 = local_238._inner._inner.
                                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                .
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                .
                                super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                ._content;
LAB_004893d8:
                      Lib::CoproductImpl::TrivialOperations::Destr::
                      DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                      ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                      *)pcVar13);
                    }
                  }
LAB_004893dd:
                  if ((local_208._inner._inner.
                       super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                       .
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                       .
                       super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                       ._0_8_ & 1) == 0) {
                    Lib::CoproductImpl::TrivialOperations::Destr::
                    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                    ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                    *)local_208._inner._inner.
                                      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                      .
                                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                      .
                                      super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                      ._content);
                  }
                }
                if (lVar18 == lVar10 + (ulong)(lVar10 == 0)) break;
                lVar5 = lVar18 * 0x1c;
                lVar18 = lVar18 + 1;
                pbVar8 = (byte *)(lVar5 + pmVar2[1]);
              } while (pmVar2[1] != 0);
            }
            mpz_clear(&_Stack_260);
            lVar18 = local_1b0;
            mpz_clear((__mpz_struct *)local_270);
            if (local_2a0 == local_240) break;
            lVar10 = local_2a0 + 1;
            pIVar15 = (IntegerConstantType *)(local_2a0 * 0x30 + *(long *)(lVar18 + 8));
          } while( true );
        }
      }
      else {
        pRVar16 = *(RealConstantType **)(local_1b0 + 8);
        lVar10 = *(long *)(local_1b0 + 0x10) - (long)pRVar16;
        if (pRVar16 != (RealConstantType *)0x0 && lVar10 != 0) {
          local_240 = (lVar10 >> 4) * -0x5555555555555555;
          local_240 = local_240 + (ulong)(local_240 == 0);
          lVar10 = 1;
          do {
            local_2a0 = lVar10;
            Kernel::RealConstantType::RealConstantType((RealConstantType *)local_270,pRVar16);
            local_250 = pRVar16[1].super_RationalConstantType._num._val[0]._mp_alloc;
            pmVar2 = pRVar16[1].super_RationalConstantType._num._val[0]._mp_d;
            pbVar8 = (byte *)pmVar2[1];
            local_248 = pmVar2;
            if (pbVar8 != (byte *)0x0 && pmVar2[2] - (long)pbVar8 != 0) {
              lVar10 = ((long)(pmVar2[2] - (long)pbVar8) >> 2) * 0x6db6db6db6db6db7;
              lVar18 = 1;
              do {
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[4] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[8] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[9] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[10] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0xb] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0xc] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0xd] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0xe] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0xf] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0x10] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0x11] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0x12] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[0x13] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._21_3_ = 0;
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._0_1_ = *pbVar8 & 3;
                if (local_2e8.super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._0_1_ == 0) {
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content._0_4_ = *(undefined4 *)(pbVar8 + 1);
                  uVar3 = *(undefined8 *)(pbVar8 + 9);
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content[8] = (char)uVar3;
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content._9_6_ = SUB86((ulong)uVar3 >> 8,0);
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content[0xf] = (char)((ulong)uVar3 >> 0x38);
                }
                else if (local_2e8.super_PolyNfSuper._inner.
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                         .
                         super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                         ._0_1_ == 1) {
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content._0_4_ = *(undefined4 *)(pbVar8 + 1);
                }
                else {
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content[8] = '\0';
                  uVar3 = *(undefined8 *)(pbVar8 + 10);
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content._0_4_ = *(uint *)(pbVar8 + 1) & 0xffffff03;
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content[4] = (char)((uint)*(undefined4 *)(pbVar8 + 2) >> 0x18);
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content._9_6_ = SUB86(uVar3,0);
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content[0xf] = (char)((ulong)uVar3 >> 0x30);
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content[0x10] = (char)((ulong)uVar3 >> 0x38);
                  local_2e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._content._17_3_ = 0;
                }
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[7] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[5] = '\0';
                local_2e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content[6] = '\0';
                local_2d0 = *(int *)(pbVar8 + 0x18);
                Kernel::PolyNf::tryVar(&local_2e8);
                if (local_2f0 == '\x01') {
                  AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>::AnyNumber
                            ((AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>
                              *)local_1a8,(Numeral<RealTraits> *)local_270);
                  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                  ::FlatMeetLattice(&local_208,
                                    (AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>
                                     *)local_1a8);
                  Lib::CoproductImpl::TrivialOperations::Destr::
                  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                  ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                  *)local_1a8);
                  if (local_2d0 == 1) {
                    Kernel::RealConstantType::RealConstantType
                              ((RealConstantType *)&local_298,(RealConstantType *)local_270);
                    bVar6 = canDivideBy((RealConstantType *)&local_298);
                    mpz_clear(local_298._den._val);
                    mpz_clear((__mpz_struct *)&local_298);
                    if (!bVar6) goto LAB_00489b75;
                    if (local_2c8._maxEntries <= local_2c8._noOfEntries) {
                      Lib::
                      Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
                      ::expand(&local_2c8);
                    }
                    uVar14 = (int)local_2ec +
                             (uint)(local_2ec == (MaybeUninit<Kernel::Variable>)0x0);
                    uVar4 = (ulong)uVar14 % (local_2c8._0_8_ & 0xffffffff);
                    pEVar12 = local_2c8._entries + uVar4;
                    uVar1 = local_2c8._entries[uVar4].code;
                    while (uVar1 != 0) {
                      if ((uVar1 == uVar14) && (pEVar12->_key == local_2ec)) {
                        Lib::CoproductImpl::TrivialOperations::MoveCons::
                        DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                        ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                       *)&local_158,
                                      (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                       *)&(pEVar12->_value).__align);
                        Lib::CoproductImpl::TrivialOperations::CopyCons::
                        DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                        ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                       *)local_1e0,
                                      (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                       *)&local_208);
                        FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                        ::meet(&local_130,&local_158,
                               (FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                                *)local_1e0);
                        if ((local_1e0[0] & 1) == 0) {
                          Lib::CoproductImpl::TrivialOperations::Destr::
                          DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                          ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                          *)(local_1e0 + 1));
                        }
                        Lib::CoproductImpl::TrivialOperations::MoveCons::
                        DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                        ::operator=((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                     *)&(pEVar12->_value).__align,
                                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                     *)&local_130);
                        if ((local_130._inner._inner.
                             super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                             .
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                             .
                             super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                             ._0_1_ & 1) == 0) {
                          Lib::CoproductImpl::TrivialOperations::Destr::
                          DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                          ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                          *)((long)&local_130._inner._inner.
                                                                                                        
                                                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                                  .
                                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                                  .
                                                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                            + 1));
                        }
                        if ((local_158._inner._inner.
                             super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                             .
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                             .
                             super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                             ._0_1_ & 1) != 0) goto LAB_00489bc4;
                        pcVar13 = (char *)((long)&local_158._inner._inner.
                                                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                                  .
                                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                                  .
                                                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                          + 1);
                        goto LAB_00489bbf;
                      }
                      pEVar12 = pEVar12 + 1;
                      if (pEVar12 == local_2c8._afterLast) {
                        pEVar12 = local_2c8._entries;
                      }
                      uVar1 = pEVar12->code;
                    }
                    local_2c8._noOfEntries = local_2c8._noOfEntries + 1;
                    Lib::CoproductImpl::TrivialOperations::CopyCons::
                    DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                    ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                   *)&local_180,
                                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                   *)&local_208);
                    (pEVar12->_key).__align = (anon_struct_4_0_00000001_for___align)local_2ec;
                    Lib::CoproductImpl::TrivialOperations::MoveCons::
                    DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                   *)&(pEVar12->_value).__align,
                                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                   *)&local_180);
                    pEVar12->code = uVar14;
                    if ((local_180._inner._inner.
                         super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                         .
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                         .
                         super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                         ._0_1_ & 1) == 0) {
                      pcVar13 = (char *)((long)&local_180._inner._inner.
                                                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                                .
                                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                                .
                                                super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                        + 1);
                      goto LAB_00489bbf;
                    }
                  }
                  else {
LAB_00489b75:
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[7] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[8] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[9] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[10] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0xb] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0xc] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0xd] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0xe] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0xf] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x10] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x11] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x12] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x13] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x14] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x15] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x16] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x17] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x18] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x19] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1a] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1b] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1c] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1d] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1e] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x1f] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x20] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x21] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x22] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._content[0x23] = '\0';
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._37_3_ = 0;
                    local_238._inner._inner.
                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                    .
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                    .
                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                    ._0_8_ = 1;
                    Lib::
                    Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
                    ::replaceOrInsert(&local_2c8,(Variable)local_2ec.__align,&local_238);
                    if ((local_238._inner._inner.
                         super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                         .
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                         .
                         super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                         ._0_8_ & 1) == 0) {
                      pcVar13 = local_238._inner._inner.
                                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                .
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                .
                                super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                ._content;
LAB_00489bbf:
                      Lib::CoproductImpl::TrivialOperations::Destr::
                      DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                      ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                      *)pcVar13);
                    }
                  }
LAB_00489bc4:
                  if ((local_208._inner._inner.
                       super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                       .
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                       .
                       super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                       ._0_8_ & 1) == 0) {
                    Lib::CoproductImpl::TrivialOperations::Destr::
                    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                    ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                    *)local_208._inner._inner.
                                      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                      .
                                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                      .
                                      super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                      ._content);
                  }
                }
                if (lVar18 == lVar10 + (ulong)(lVar10 == 0)) break;
                lVar5 = lVar18 * 0x1c;
                lVar18 = lVar18 + 1;
                pbVar8 = (byte *)(lVar5 + pmVar2[1]);
              } while (pmVar2[1] != 0);
            }
            mpz_clear(&_Stack_260);
            mpz_clear((__mpz_struct *)local_270);
            if (local_2a0 == local_240) break;
            lVar10 = local_2a0 + 1;
            pRVar16 = (RealConstantType *)(local_2a0 * 0x30 + *(long *)(local_1b0 + 8));
          } while( true );
        }
      }
      Lib::
      IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
      ::tryNext((Option<Kernel::AnyPoly> *)local_270,local_108);
      if (local_270[0] != true) break;
      local_100.super_OptionBase<Kernel::AnyPoly>._elem._elem._0_1_ = local_270[4] & 3;
      local_100.super_OptionBase<Kernel::AnyPoly>._elem._elem._5_4_ = 0;
      local_100.super_OptionBase<Kernel::AnyPoly>._elem._elem._17_3_ = 0;
      local_100.super_OptionBase<Kernel::AnyPoly>._elem._elem._9_3_ =
           (undefined3)stack0xfffffffffffffd9d;
      local_100.super_OptionBase<Kernel::AnyPoly>._elem._elem._12_5_ =
           (undefined5)((ulong)stack0xfffffffffffffd9d >> 0x18);
    } while( true );
  }
  Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_a0);
  pEVar12 = local_2c8._entries;
  do {
    if (pEVar12 == local_2c8._afterLast) {
LAB_00489fd7:
      uVar9 = 0;
LAB_00489fd9:
      Lib::
      Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
      ::clear(&local_2c8);
      RVar19._8_4_ = uVar9;
      RVar19.simplified = local_1b8;
      RVar19._12_4_ = 0;
      return RVar19;
    }
    if (pEVar12->code != 0) {
      pEVar17 = (Entry *)0x0;
      break;
    }
    pEVar12 = pEVar12 + 1;
  } while( true );
LAB_00489da0:
  Lib::CoproductImpl::TrivialOperations::CopyCons::
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
  ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                 *)local_e8,
                (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                 *)&(pEVar12->_value).__align);
  pEVar11 = pEVar17;
  if (((uint)_local_e8 & 1) == 0) {
    if ((local_e8[1] & 3) == 1) {
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)local_1e0,(IntegerConstantType *)(local_e8 + 2));
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)(local_1e0 + 0x10),&local_d6);
      Kernel::RationalConstantType::RationalConstantType((RationalConstantType *)local_270,1);
      bVar6 = Kernel::RationalConstantType::operator==
                        ((RationalConstantType *)local_270,(RationalConstantType *)local_1e0);
      mpz_clear(&_Stack_260);
      mpz_clear((__mpz_struct *)local_270);
      mpz_clear((__mpz_struct *)(local_1e0 + 0x10));
      mpz_clear((__mpz_struct *)local_1e0);
LAB_00489f0c:
      if (bVar6 != false) goto LAB_00489f17;
    }
    else {
      if (((uint)_local_e8 & 0x300) != 0) {
        Kernel::RealConstantType::RealConstantType
                  ((RealConstantType *)local_1e0,(RealConstantType *)(local_e8 + 2));
        Kernel::RealConstantType::RealConstantType((RealConstantType *)local_270,1);
        bVar6 = Kernel::RationalConstantType::operator==
                          ((RationalConstantType *)local_270,(RationalConstantType *)local_1e0);
        mpz_clear(&_Stack_260);
        mpz_clear((__mpz_struct *)local_270);
        mpz_clear((__mpz_struct *)(local_1e0 + 0x10));
        mpz_clear((__mpz_struct *)local_1e0);
        goto LAB_00489f0c;
      }
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)local_1e0,(IntegerConstantType *)(local_e8 + 2));
      Kernel::IntegerConstantType::IntegerConstantType((IntegerConstantType *)local_270,1);
      iVar7 = mpz_cmp((__mpz_struct *)local_270,(__mpz_struct *)local_1e0);
      mpz_clear((__mpz_struct *)local_270);
      mpz_clear((__mpz_struct *)local_1e0);
      if (iVar7 == 0) goto LAB_00489f17;
    }
    pEVar11 = pEVar12;
    if ((pEVar17 != (Entry *)0x0) && (pEVar11 = pEVar17, (uint)pEVar12->_key < (uint)pEVar17->_key))
    {
      pEVar11 = pEVar12;
    }
  }
LAB_00489f17:
  if (((uint)_local_e8 & 1) == 0) {
    Lib::CoproductImpl::TrivialOperations::Destr::
    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
    ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                    *)(local_e8 + 1));
  }
  do {
    pEVar12 = pEVar12 + 1;
    if (pEVar12 == local_2c8._afterLast) {
      if (pEVar11 == (Entry *)0x0) goto LAB_00489fd7;
      _local_e8 = pEVar11->_key;
      this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
              *)(auStack_e6 + 2);
      Lib::CoproductImpl::TrivialOperations::CopyCons::
      DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
      ::DefaultImpl(this,(DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
                          *)((long)&pEVar11->_value + 1));
      local_c0 = (undefined1)local_184;
      local_5c = _local_e8;
      Lib::CoproductImpl::TrivialOperations::CopyCons::
      DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
      ::DefaultImpl(&local_58,this);
      local_34 = local_c0;
      RVar19 = generalizeBottomUp<Inferences::EvaluateMonom<Inferences::NumeralMultiplicationGeneralizationImpl::Generalize>>
                         (local_1b8,
                          (EvaluateMonom<Inferences::NumeralMultiplicationGeneralizationImpl::Generalize>
                           *)&local_5c.__align);
      local_1b8 = RVar19.simplified;
      uVar9 = RVar19._8_4_;
      Lib::CoproductImpl::TrivialOperations::Destr::
      DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
      ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                      *)&local_58);
      Lib::CoproductImpl::TrivialOperations::Destr::
      DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
      ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                      *)this);
      goto LAB_00489fd9;
    }
    pEVar17 = pEVar11;
  } while (pEVar12->code == 0);
  goto LAB_00489da0;
}

Assistant:

SimplifyingGeneratingInference1::Result applyRule(Clause* cl, bool doOrderingCheck) 
{
  DEBUG("input clause: ", *cl);

  NumeralMap numerals;

  /* scan candidate numeral multiplications n * x  */
  for (auto poly : iterPolynoms(cl)) {
    poly.apply([&](auto& poly) {
      for (auto monom : poly->iterSummands()) {
        for (auto factor : monom.factors->iter()) {
          
          auto var = factor.term.tryVar();
          if (var.isSome()) {
            auto numeral = FlatMeetLattice<AnyNumber<Numeral>>(AnyNumber<Numeral>(monom.numeral));

            if (factor.power == 1 && canDivideBy(monom.numeral)) {
              /* we found numeral * var */
              numerals.updateOrInit(var.unwrap(), 
                  /* update the numeral if there was already one associated with this variable */
                  [&](auto n) 
                  { return n.meet(numeral); },
                  /* init the numeral if there was none */
                  [&]() { return numeral; });
            } else {
              ASS_NEQ(factor.power, 0)
              /* x^n ==> we cannot generalize. hence we set the numeral for this variable to bottom. */
              numerals.replaceOrInsert(var.unwrap(), FlatMeetLattice<AnyNumber<Numeral>>::bot());
            }
          }
        }
      }
    });
  }

  /* select one of the variables we can generalize on */
  Option<typename NumeralMap::Entry &> selected;
  for (auto& e : iterTraits(numerals.iter()) ) {
    FlatMeetLattice<AnyNumber<Numeral>> num = e.value();
    if (!num.isBot() && !num.unwrap().apply(isOne)) {
      /* we use the entry with the least variable, in order to prevent non-determinism */
      if (selected.isNone() || e.key() < selected.unwrap().key()) {
        selected = decltype(selected)(e);
      }
    }
  }

  if (selected.isNone()) {
    DEBUG("not applicable")
    return SimplifyingGeneratingInference1::Result::nop(cl);
  } else {
    auto& e = selected.unwrap();
    DEBUG("selected generalization: (", e.key(), ", ", e.value(), ")");
    Generalize gen { e.key(), e.value().unwrap(), doOrderingCheck };
    return generalizeBottomUp(cl, EvaluateMonom<Generalize> {gen});
  }
}